

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

holder<unsigned_long> * __thiscall
cs::allocator_type<cs_impl::any::holder<unsigned_long>,64ul,cs_impl::default_allocator_provider>::
alloc<unsigned_long_const&>
          (allocator_type<cs_impl::any::holder<unsigned_long>,_64UL,_cs_impl::default_allocator_provider>
           *this,unsigned_long *args)

{
  long lVar1;
  __int_type _Var2;
  holder<unsigned_long> *phVar3;
  new_allocator<cs_impl::any::holder<unsigned_long>_> *in_RSI;
  new_allocator<cs_impl::any::holder<unsigned_long>_> *in_RDI;
  holder<unsigned_long> *ptr;
  holder<unsigned_long> *in_stack_ffffffffffffffd8;
  size_type __n;
  
  __n = 0;
  if (*(long *)(in_RDI + 0x208) != 0) {
    _Var2 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base<unsigned_long> *)0x0);
    if (_Var2 == 0) {
      lVar1 = *(long *)(in_RDI + 0x208);
      *(long *)(in_RDI + 0x208) = lVar1 + -1;
      phVar3 = *(holder<unsigned_long> **)(in_RDI + lVar1 * 8 + -8);
      goto LAB_004b9d22;
    }
  }
  phVar3 = __gnu_cxx::new_allocator<cs_impl::any::holder<unsigned_long>_>::allocate
                     (in_RSI,__n,in_RDI);
LAB_004b9d22:
  __gnu_cxx::new_allocator<cs_impl::any::holder<unsigned_long>>::
  construct<cs_impl::any::holder<unsigned_long>,unsigned_long_const&>
            (in_RDI,in_stack_ffffffffffffffd8,(unsigned_long *)0x4b9d3d);
  return phVar3;
}

Assistant:

inline T *alloc(ArgsT &&...args)
		{
			T *ptr = nullptr;
			if (mOffset > 0 && global_thread_counter == 0)
				ptr = mPool[--mOffset];
			else
				ptr = mAlloc.allocate(1);
			mAlloc.construct(ptr, std::forward<ArgsT>(args)...);
			return ptr;
		}